

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O3

drwav * drwav_open_ex(drwav_read_proc onRead,drwav_seek_proc onSeek,drwav_chunk_proc onChunk,
                     void *pReadSeekUserData,void *pChunkUserData,drwav_uint32 flags)

{
  drwav_bool32 dVar1;
  drwav *pWav;
  
  pWav = (drwav *)malloc(0x1a0);
  if (pWav != (drwav *)0x0) {
    dVar1 = drwav_init_ex(pWav,onRead,onSeek,onChunk,pReadSeekUserData,pChunkUserData,flags);
    if (dVar1 != 0) {
      return pWav;
    }
    free(pWav);
  }
  return (drwav *)0x0;
}

Assistant:

drwav* drwav_open_ex(drwav_read_proc onRead, drwav_seek_proc onSeek, drwav_chunk_proc onChunk, void* pReadSeekUserData, void* pChunkUserData, drwav_uint32 flags)
{
    drwav* pWav = (drwav*)DRWAV_MALLOC(sizeof(*pWav));
    if (pWav == NULL) {
        return NULL;
    }

    if (!drwav_init_ex(pWav, onRead, onSeek, onChunk, pReadSeekUserData, pChunkUserData, flags)) {
        DRWAV_FREE(pWav);
        return NULL;
    }

    return pWav;
}